

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog_util.c
# Opt level: O0

int read_full_contents(file_stream *strm)

{
  void *pvVar1;
  ssize_t sVar2;
  void *in_RDI;
  char *newbuf;
  int ret;
  char *buf;
  size_t capacity;
  size_t filled;
  size_t in_stack_ffffffffffffffc0;
  ulong uVar3;
  int local_2c;
  void *local_28;
  ulong local_20;
  ulong count;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  
  count = 0;
  local_20 = 0x1000;
  local_28 = xmalloc(in_stack_ffffffffffffffc0);
  if (local_28 == (void *)0x0) {
    iVar4 = -1;
  }
  else {
    do {
      pvVar1 = local_28;
      if (count == local_20) {
        if (local_20 != 0xffffffffffffffff) {
          uVar3 = local_20;
          if (-local_20 - 1 <= local_20) {
            uVar3 = -local_20 - 1;
          }
          local_20 = uVar3 + local_20;
          pvVar1 = realloc(local_28,local_20);
          if (pvVar1 != (void *)0x0) goto LAB_00103134;
        }
        msg("Out of memory!  %s is too large to be processed by this program as currently implemented."
            ,*(undefined8 *)((long)in_RDI + 8));
        local_2c = -1;
LAB_0010319f:
        free(local_28);
        return local_2c;
      }
LAB_00103134:
      local_28 = pvVar1;
      sVar2 = xread((file_stream *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                    in_RDI,count);
      local_2c = (int)sVar2;
      if (local_2c < 0) goto LAB_0010319f;
      count = (long)local_2c + count;
    } while (local_2c != 0);
    *(void **)((long)in_RDI + 0x20) = local_28;
    *(ulong *)((long)in_RDI + 0x28) = count;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int
read_full_contents(struct file_stream *strm)
{
	size_t filled = 0;
	size_t capacity = 4096;
	char *buf;
	int ret;

	buf = xmalloc(capacity);
	if (buf == NULL)
		return -1;
	do {
		if (filled == capacity) {
			char *newbuf;

			if (capacity == SIZE_MAX)
				goto oom;
			capacity += MIN(SIZE_MAX - capacity, capacity);
			newbuf = realloc(buf, capacity);
			if (newbuf == NULL)
				goto oom;
			buf = newbuf;
		}
		ret = xread(strm, &buf[filled], capacity - filled);
		if (ret < 0)
			goto err;
		filled += ret;
	} while (ret != 0);

	strm->mmap_mem = buf;
	strm->mmap_size = filled;
	return 0;

err:
	free(buf);
	return ret;
oom:
	msg("Out of memory!  %"TS" is too large to be processed by "
	    "this program as currently implemented.", strm->name);
	ret = -1;
	goto err;
}